

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::Texture2DArrayFilteringCase::iterate(Texture2DArrayFilteringCase *this)

{
  float *pfVar1;
  size_t *psVar2;
  ostringstream *poVar3;
  float fVar4;
  deUint32 dVar5;
  TestLog *log;
  Texture2DArray *pTVar6;
  RenderContext *context;
  pointer pFVar7;
  bool bVar8;
  int i;
  int iVar9;
  deUint32 dVar10;
  SamplerType SVar11;
  undefined4 extraout_var;
  RenderTarget *pRVar12;
  undefined8 *puVar13;
  long lVar14;
  NotSupportedError *this_00;
  int i_3;
  char *description;
  qpTestResult testResult;
  ulong uVar15;
  ulong uVar16;
  TestContext *pTVar17;
  uint uVar18;
  void *pvVar19;
  pointer pFVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  Surface rendered;
  RandomViewport viewport;
  Texture2DArrayView local_388;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  LookupPrecision local_348;
  PixelFormat pixelFormat;
  ulong local_308 [3];
  float local_2ec;
  float local_2e8;
  float local_2e4;
  float local_2e0;
  float local_2dc;
  float local_2d8;
  LodPrecision lodPrecision;
  IVec4 colorBits;
  ulong local_2b8 [3];
  ScopedLogSection section;
  TextureFormat texFmt;
  ReferenceParams refParams;
  Vector<int,_4> res;
  ios_base local_188 [8];
  ios_base local_180 [272];
  TextureFormatInfo fmtInfo;
  
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar14 = CONCAT44(extraout_var,iVar9);
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  dVar10 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  uVar18 = ((uint)this->m_caseNdx >> 0x10 ^ this->m_caseNdx ^ 0x3d) * 9;
  uVar18 = (uVar18 >> 4 ^ uVar18) * 0x27d4eb2d;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,pRVar12,0x40,0x40,uVar18 >> 0xf ^ dVar10 ^ uVar18);
  iVar9 = this->m_caseNdx;
  pFVar20 = (this->m_cases).
            super__Vector_base<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start;
  texFmt = ((pFVar20[iVar9].texture)->m_refTexture).super_TextureLevelPyramid.m_format;
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_378 = &local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"Test","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
  std::ostream::operator<<(&res,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
  std::ios_base::~ios_base(local_188);
  uVar16 = CONCAT44(local_348.uvwBits.m_data[0],local_348.coordBits.m_data[2]) + uStack_370;
  uVar15 = 0xf;
  if (local_378 != &local_368) {
    uVar15 = local_368;
  }
  if (uVar15 < uVar16) {
    uVar15 = 0xf;
    if ((int *)local_348.coordBits.m_data._0_8_ != local_348.uvwBits.m_data + 1) {
      uVar15 = CONCAT44(local_348.uvwBits.m_data[2],local_348.uvwBits.m_data[1]);
    }
    if (uVar15 < uVar16) goto LAB_0113e1ee;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_348,0,(char *)0x0,(ulong)local_378);
  }
  else {
LAB_0113e1ee:
    puVar13 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_378,local_348.coordBits.m_data._0_8_);
  }
  refParams.super_RenderParams._0_8_ = refParams.super_RenderParams.w.m_data + 1;
  pfVar1 = (float *)(puVar13 + 2);
  if ((float *)*puVar13 == pfVar1) {
    refParams.super_RenderParams.w.m_data._4_8_ = *(undefined8 *)pfVar1;
    refParams.super_RenderParams.w.m_data[3] = *(float *)(puVar13 + 3);
    refParams.super_RenderParams.bias = *(float *)((long)puVar13 + 0x1c);
  }
  else {
    refParams.super_RenderParams.w.m_data._4_8_ = *(undefined8 *)pfVar1;
    refParams.super_RenderParams._0_8_ = (float *)*puVar13;
  }
  refParams.super_RenderParams._8_8_ = puVar13[1];
  *puVar13 = pfVar1;
  puVar13[1] = 0;
  *(undefined1 *)pfVar1 = 0;
  pixelFormat._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pixelFormat,"Test ","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
  std::ostream::operator<<(&res,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
  std::ios_base::~ios_base(local_188);
  uVar16 = 0xf;
  if ((ulong *)pixelFormat._0_8_ != local_308) {
    uVar16 = local_308[0];
  }
  if (uVar16 < (ulong)(colorBits.m_data._8_8_ + pixelFormat._8_8_)) {
    uVar16 = 0xf;
    if ((ulong *)colorBits.m_data._0_8_ != local_2b8) {
      uVar16 = local_2b8[0];
    }
    if (uVar16 < (ulong)(colorBits.m_data._8_8_ + pixelFormat._8_8_)) goto LAB_0113e330;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&colorBits,0,(char *)0x0,pixelFormat._0_8_);
  }
  else {
LAB_0113e330:
    puVar13 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&pixelFormat,colorBits.m_data._0_8_);
  }
  rendered._0_8_ = &rendered.m_pixels.m_cap;
  psVar2 = puVar13 + 2;
  if ((size_t *)*puVar13 == psVar2) {
    rendered.m_pixels.m_cap = *psVar2;
  }
  else {
    rendered.m_pixels.m_cap = *psVar2;
    rendered._0_8_ = (size_t *)*puVar13;
  }
  rendered.m_pixels.m_ptr = (void *)puVar13[1];
  *puVar13 = psVar2;
  puVar13[1] = 0;
  *(undefined1 *)psVar2 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&refParams,(string *)&rendered);
  if ((size_t *)rendered._0_8_ != &rendered.m_pixels.m_cap) {
    operator_delete((void *)rendered._0_8_,rendered.m_pixels.m_cap + 1);
  }
  if ((ulong *)colorBits.m_data._0_8_ != local_2b8) {
    operator_delete((void *)colorBits.m_data._0_8_,local_2b8[0] + 1);
  }
  if ((ulong *)pixelFormat._0_8_ != local_308) {
    operator_delete((void *)pixelFormat._0_8_,local_308[0] + 1);
  }
  if ((float *)refParams.super_RenderParams._0_8_ != refParams.super_RenderParams.w.m_data + 1) {
    operator_delete((void *)refParams.super_RenderParams._0_8_,
                    refParams.super_RenderParams.w.m_data._4_8_ + 1);
  }
  if ((int *)local_348.coordBits.m_data._0_8_ != local_348.uvwBits.m_data + 1) {
    operator_delete((void *)local_348.coordBits.m_data._0_8_,
                    CONCAT44(local_348.uvwBits.m_data[2],local_348.uvwBits.m_data[1]) + 1);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378,local_368 + 1);
  }
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&refParams,TEXTURETYPE_2D_ARRAY);
  tcu::Surface::Surface(&rendered,viewport.width,viewport.height);
  local_358 = 0;
  uStack_350 = 0;
  local_368 = 0;
  uStack_360 = 0;
  local_378 = (undefined8 *)0x0;
  uStack_370 = 0;
  if ((viewport.width < 0x40) || (viewport.height < 0x40)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Too small render target",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFilteringTests.cpp"
               ,0x347);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  glu::mapGLSampler((Sampler *)&res,this->m_wrapS,this->m_wrapT,this->m_wrapT,this->m_minFilter,
                    this->m_magFilter);
  refParams.sampler.wrapS = res.m_data[0];
  refParams.sampler.wrapT = res.m_data[1];
  refParams.sampler.wrapR = res.m_data[2];
  refParams.sampler.minFilter = res.m_data[3];
  SVar11 = glu::TextureTestUtil::getSamplerType(texFmt);
  refParams.super_RenderParams.samplerType = SVar11;
  refParams.lodMode = LODMODE_EXACT;
  refParams.super_RenderParams.colorBias.m_data[0] = fmtInfo.lookupBias.m_data[0];
  refParams.super_RenderParams.colorBias.m_data[1] = fmtInfo.lookupBias.m_data[1];
  refParams.super_RenderParams.colorBias.m_data[2] = fmtInfo.lookupBias.m_data[2];
  refParams.super_RenderParams.colorBias.m_data[3] = fmtInfo.lookupBias.m_data[3];
  refParams.super_RenderParams.colorScale.m_data[0] = fmtInfo.lookupScale.m_data[0];
  refParams.super_RenderParams.colorScale.m_data[1] = fmtInfo.lookupScale.m_data[1];
  refParams.super_RenderParams.colorScale.m_data[2] = fmtInfo.lookupScale.m_data[2];
  refParams.super_RenderParams.colorScale.m_data[3] = fmtInfo.lookupScale.m_data[3];
  res.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(res.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"Approximate lod per axis = ",0x1b);
  pFVar20 = pFVar20 + iVar9;
  tcu::operator<<((ostream *)poVar3,&pFVar20->lod);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,", offset = ",0xb);
  tcu::operator<<((ostream *)poVar3,&pFVar20->offset);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_180);
  local_2dc = (pFVar20->offset).m_data[0];
  local_2d8 = (pFVar20->offset).m_data[1];
  local_2e4 = (pFVar20->lod).m_data[1] * 0.6931472;
  local_2e0 = expf((pFVar20->lod).m_data[0] * 0.6931472);
  local_2ec = (float)viewport.width;
  pTVar6 = this->m_gradientTex;
  local_2e8 = (float)(pTVar6->m_refTexture).m_width;
  fVar21 = expf(local_2e4);
  fVar23 = (pFVar20->layerRange).m_data[0];
  fVar4 = (pFVar20->layerRange).m_data[1];
  local_378 = (undefined8 *)CONCAT44(local_2d8,local_2dc);
  fVar22 = ((float)viewport.height * fVar21) / (float)(pTVar6->m_refTexture).m_height + local_2d8;
  fVar21 = fVar23 * 0.5 + fVar4 * 0.5;
  uStack_370 = CONCAT44(local_2dc,fVar23);
  local_368 = CONCAT44(fVar21,fVar22);
  fVar23 = (local_2ec * local_2e0) / local_2e8 + local_2dc;
  uStack_360 = CONCAT44(local_2d8,fVar23);
  local_358 = CONCAT44(fVar23,fVar21);
  uStack_350 = CONCAT44(fVar4,fVar22);
  (**(code **)(lVar14 + 0xb8))(0x8c1a,pFVar20->texture->m_glTexture);
  (**(code **)(lVar14 + 0x1360))(0x8c1a,0x2801,this->m_minFilter);
  (**(code **)(lVar14 + 0x1360))(0x8c1a,0x2800,this->m_magFilter);
  (**(code **)(lVar14 + 0x1360))(0x8c1a,0x2802,this->m_wrapS);
  (**(code **)(lVar14 + 0x1360))(0x8c1a,0x2803,this->m_wrapT);
  (**(code **)(lVar14 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,(float *)&local_378,&refParams.super_RenderParams);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_348.coordBits.m_data[0] = 8;
  local_348.coordBits.m_data[1] = 3;
  pvVar19 = (void *)rendered.m_pixels.m_cap;
  if (rendered.m_pixels.m_cap != 0) {
    pvVar19 = rendered.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&res,(TextureFormat *)&local_348,rendered.m_width,
             rendered.m_height,1,pvVar19);
  glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)&res);
  dVar10 = this->m_minFilter;
  dVar5 = this->m_magFilter;
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  pixelFormat.redBits = (pRVar12->m_pixelFormat).redBits;
  pixelFormat.greenBits = (pRVar12->m_pixelFormat).greenBits;
  pixelFormat.blueBits = (pRVar12->m_pixelFormat).blueBits;
  pixelFormat.alphaBits = (pRVar12->m_pixelFormat).alphaBits;
  local_348.coordBits.m_data[0] = pixelFormat.redBits;
  local_348.coordBits.m_data[1] = pixelFormat.greenBits;
  local_348.coordBits.m_data[2] = pixelFormat.blueBits;
  local_348.uvwBits.m_data[0] = pixelFormat.alphaBits;
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  res.m_data[3] = 0;
  lVar14 = 0;
  do {
    res.m_data[lVar14] =
         local_348.coordBits.m_data[lVar14] + ((dVar5 == 0x2600 && dVar10 == 0x2600) | 0xfffffffe);
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_388.m_numLevels = 0;
  local_388._4_4_ = 0;
  local_388.m_levels = (ConstPixelBufferAccess *)0x0;
  colorBits.m_data[0] = 0;
  colorBits.m_data[1] = 0;
  colorBits.m_data[2] = 0;
  colorBits.m_data[3] = 0;
  lVar14 = 0;
  do {
    iVar9 = (&local_388.m_numLevels)[lVar14];
    if ((&local_388.m_numLevels)[lVar14] < res.m_data[lVar14]) {
      iVar9 = res.m_data[lVar14];
    }
    colorBits.m_data[lVar14] = iVar9;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  lodPrecision.rule = RULE_OPENGL;
  lVar14 = 0;
  do {
    local_348.coordBits.m_data[lVar14] = 0x16;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  lVar14 = 3;
  do {
    local_348.coordBits.m_data[lVar14] = 0x10;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 6);
  local_348.colorThreshold.m_data[0] = 0.0;
  local_348.colorThreshold.m_data[1] = 0.0;
  local_348.colorThreshold.m_data[2] = 0.0;
  local_348.colorThreshold.m_data[3] = 0.0;
  local_348.colorMask.m_data[0] = true;
  local_348.colorMask.m_data[1] = true;
  local_348.colorMask.m_data[2] = true;
  local_348.colorMask.m_data[3] = true;
  lodPrecision.derivateBits = 0x12;
  lodPrecision.lodBits = 6;
  tcu::computeFixedPointThreshold((tcu *)&local_388,&colorBits);
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  res.m_data[3] = 0;
  lVar14 = 0;
  do {
    res.m_data[lVar14] =
         (int)((float)(&local_388.m_numLevels)[lVar14] /
              refParams.super_RenderParams.colorScale.m_data[lVar14]);
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_348.colorThreshold.m_data[0] = (float)res.m_data[0];
  local_348.colorThreshold.m_data[1] = (float)res.m_data[1];
  local_348.colorThreshold.m_data[2] = (float)res.m_data[2];
  local_348.colorThreshold.m_data[3] = (float)res.m_data[3];
  local_348.coordBits.m_data[0] = 0x14;
  local_348.coordBits.m_data[1] = 0x14;
  local_348.coordBits.m_data[2] = 0x14;
  local_348.uvwBits.m_data[0] = 7;
  local_348.uvwBits.m_data[1] = 7;
  local_348.uvwBits.m_data[2] = 0;
  local_348.colorMask.m_data[1] = 0 < pixelFormat.greenBits;
  local_348.colorMask.m_data[0] = 0 < pixelFormat.redBits;
  local_348.colorMask.m_data[2] = 0 < pixelFormat.blueBits;
  local_348.colorMask.m_data[3] = 0 < pixelFormat.alphaBits;
  pTVar17 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  local_388.m_numLevels = 8;
  local_388._4_4_ = 3;
  pvVar19 = (void *)rendered.m_pixels.m_cap;
  if (rendered.m_pixels.m_cap != 0) {
    pvVar19 = rendered.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&res,(TextureFormat *)&local_388,rendered.m_width,
             rendered.m_height,1,pvVar19);
  local_388.m_levels = (pFVar20->texture->m_refTexture).m_view.m_levels;
  local_388.m_numLevels = (pFVar20->texture->m_refTexture).m_view.m_numLevels;
  bVar8 = glu::TextureTestUtil::verifyTextureResult
                    (pTVar17,(ConstPixelBufferAccess *)&res,&local_388,(float *)&local_378,
                     &refParams,&local_348,&lodPrecision,&pixelFormat);
  if (!bVar8) {
    lodPrecision.lodBits = 4;
    local_348.uvwBits.m_data[0] = 4;
    local_348.uvwBits.m_data[1] = 4;
    local_348.uvwBits.m_data[2] = 0;
    res.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(res.m_data + 2);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,
               "Warning: Verification against high precision requirements failed, trying with lower requirements."
               ,0x61);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_180);
    pTVar17 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    local_388.m_numLevels = 8;
    local_388._4_4_ = 3;
    pvVar19 = (void *)rendered.m_pixels.m_cap;
    if (rendered.m_pixels.m_cap != 0) {
      pvVar19 = rendered.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&res,(TextureFormat *)&local_388,rendered.m_width,
               rendered.m_height,1,pvVar19);
    local_388.m_levels = (pFVar20->texture->m_refTexture).m_view.m_levels;
    local_388.m_numLevels = (pFVar20->texture->m_refTexture).m_view.m_numLevels;
    bVar8 = glu::TextureTestUtil::verifyTextureResult
                      (pTVar17,(ConstPixelBufferAccess *)&res,&local_388,(float *)&local_378,
                       &refParams,&local_348,&lodPrecision,&pixelFormat);
    if (bVar8) {
      pTVar17 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      if (pTVar17->m_testResult != QP_TEST_RESULT_PASS) goto LAB_0113ec12;
      description = "Low-quality filtering result";
      testResult = QP_TEST_RESULT_QUALITY_WARNING;
    }
    else {
      res.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar3 = (ostringstream *)(res.m_data + 2);
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar3,
                 "ERROR: Verification against low precision requirements failed, failing test case."
                 ,0x51);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_180);
      pTVar17 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Image verification failed";
      testResult = QP_TEST_RESULT_FAIL;
    }
    tcu::TestContext::setTestResult(pTVar17,testResult,description);
  }
LAB_0113ec12:
  iVar9 = this->m_caseNdx + 1;
  this->m_caseNdx = iVar9;
  pFVar20 = (this->m_cases).
            super__Vector_base<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar7 = (this->m_cases).
           super__Vector_base<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  tcu::Surface::~Surface(&rendered);
  tcu::TestLog::endSection(section.m_log);
  return (IterateResult)(iVar9 < (int)((ulong)((long)pFVar7 - (long)pFVar20) >> 5));
}

Assistant:

Texture2DArrayFilteringCase::IterateResult Texture2DArrayFilteringCase::iterate (void)
{
	const glw::Functions&			gl			= m_context.getRenderContext().getFunctions();
	const RandomViewport			viewport	(m_context.getRenderTarget(), TEX3D_VIEWPORT_WIDTH, TEX3D_VIEWPORT_HEIGHT, deStringHash(getName()) ^ deInt32Hash(m_caseNdx));
	const FilterCase&				curCase		= m_cases[m_caseNdx];
	const tcu::TextureFormat		texFmt		= curCase.texture->getRefTexture().getFormat();
	const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
	const tcu::ScopedLogSection		section		(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	ReferenceParams					refParams	(TEXTURETYPE_2D_ARRAY);
	tcu::Surface					rendered	(viewport.width, viewport.height);
	tcu::Vec3						texCoord[4];

	if (viewport.width < TEX3D_MIN_VIEWPORT_WIDTH || viewport.height < TEX3D_MIN_VIEWPORT_HEIGHT)
		throw tcu::NotSupportedError("Too small render target", "", __FILE__, __LINE__);

	// Setup params for reference.
	refParams.sampler		= glu::mapGLSampler(m_wrapS, m_wrapT, m_wrapT, m_minFilter, m_magFilter);
	refParams.samplerType	= getSamplerType(texFmt);
	refParams.lodMode		= LODMODE_EXACT;
	refParams.colorBias		= fmtInfo.lookupBias;
	refParams.colorScale	= fmtInfo.lookupScale;

	// Compute texture coordinates.
	m_testCtx.getLog() << TestLog::Message << "Approximate lod per axis = " << curCase.lod << ", offset = " << curCase.offset << TestLog::EndMessage;

	{
		const float	lodX	= curCase.lod.x();
		const float	lodY	= curCase.lod.y();
		const float	oX		= curCase.offset.x();
		const float	oY		= curCase.offset.y();
		const float	sX		= deFloatExp2(lodX)*float(viewport.width)	/ float(m_gradientTex->getRefTexture().getWidth());
		const float	sY		= deFloatExp2(lodY)*float(viewport.height)	/ float(m_gradientTex->getRefTexture().getHeight());
		const float	l0		= curCase.layerRange.x();
		const float	l1		= curCase.layerRange.y();

		texCoord[0] = tcu::Vec3(oX,		oY,		l0);
		texCoord[1] = tcu::Vec3(oX,		oY+sY,	l0*0.5f + l1*0.5f);
		texCoord[2] = tcu::Vec3(oX+sX,	oY,		l0*0.5f + l1*0.5f);
		texCoord[3] = tcu::Vec3(oX+sX,	oY+sY,	l1);
	}

	gl.bindTexture	(GL_TEXTURE_2D_ARRAY, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	gl.texParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_T,		m_wrapT);

	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);
	m_renderer.renderQuad(0, (const float*)&texCoord[0], refParams);
	glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, rendered.getAccess());

	{
		const bool				isNearestOnly	= m_minFilter == GL_NEAREST && m_magFilter == GL_NEAREST;
		const tcu::PixelFormat	pixelFormat		= m_context.getRenderTarget().getPixelFormat();
		const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
		tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
		tcu::LookupPrecision	lookupPrecision;

		lodPrecision.derivateBits		= 18;
		lodPrecision.lodBits			= 6;
		lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / refParams.colorScale;
		lookupPrecision.coordBits		= tcu::IVec3(20,20,20);
		lookupPrecision.uvwBits			= tcu::IVec3(7,7,0);
		lookupPrecision.colorMask		= getCompareMask(pixelFormat);

		const bool isHighQuality = verifyTextureResult(m_testCtx, rendered.getAccess(), curCase.texture->getRefTexture(),
													   (const float*)&texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

		if (!isHighQuality)
		{
			// Evaluate against lower precision requirements.
			lodPrecision.lodBits	= 4;
			lookupPrecision.uvwBits	= tcu::IVec3(4,4,0);

			m_testCtx.getLog() << TestLog::Message << "Warning: Verification against high precision requirements failed, trying with lower requirements." << TestLog::EndMessage;

			const bool isOk = verifyTextureResult(m_testCtx, rendered.getAccess(), curCase.texture->getRefTexture(),
												  (const float*)&texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

			if (!isOk)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
			}
			else if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality filtering result");
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}